

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Solver.cc
# Opt level: O0

void __thiscall Minisat::Solver::Solver(Solver *this)

{
  double *pdVar1;
  bool *pbVar2;
  int32_t *piVar3;
  VarOrderLt local_38 [2];
  WatcherDeleted local_28 [3];
  Solver *local_10;
  Solver *this_local;
  
  this->_vptr_Solver = (_func_int **)&PTR__Solver_0012dbc0;
  local_10 = this;
  vec<Minisat::lbool,_int>::vec(&this->model);
  LSet::LSet(&this->conflict);
  this->verbosity = 0;
  pdVar1 = DoubleOption::operator_cast_to_double_(&opt_var_decay);
  this->var_decay = *pdVar1;
  pdVar1 = DoubleOption::operator_cast_to_double_(&opt_clause_decay);
  this->clause_decay = *pdVar1;
  pdVar1 = DoubleOption::operator_cast_to_double_(&opt_random_var_freq);
  this->random_var_freq = *pdVar1;
  pdVar1 = DoubleOption::operator_cast_to_double_(&opt_random_seed);
  this->random_seed = *pdVar1;
  pbVar2 = BoolOption::operator_cast_to_bool_(&opt_luby_restart);
  this->luby_restart = (bool)(*pbVar2 & 1);
  piVar3 = IntOption::operator_cast_to_int_(&opt_ccmin_mode);
  this->ccmin_mode = *piVar3;
  piVar3 = IntOption::operator_cast_to_int_(&opt_phase_saving);
  this->phase_saving = *piVar3;
  this->rnd_pol = false;
  pbVar2 = BoolOption::operator_cast_to_bool_(&opt_rnd_init_act);
  this->rnd_init_act = (bool)(*pbVar2 & 1);
  pdVar1 = DoubleOption::operator_cast_to_double_(&opt_garbage_frac);
  this->garbage_frac = *pdVar1;
  piVar3 = IntOption::operator_cast_to_int_(&opt_min_learnts_lim);
  this->min_learnts_lim = *piVar3;
  piVar3 = IntOption::operator_cast_to_int_(&opt_restart_first);
  this->restart_first = *piVar3;
  pdVar1 = DoubleOption::operator_cast_to_double_(&opt_restart_inc);
  this->restart_inc = *pdVar1;
  this->learntsize_factor = 0.3333333333333333;
  this->learntsize_inc = 1.1;
  this->learntsize_adjust_start_confl = 100;
  this->learntsize_adjust_inc = 1.5;
  this->solves = 0;
  this->starts = 0;
  this->decisions = 0;
  this->rnd_decisions = 0;
  this->propagations = 0;
  this->conflicts = 0;
  this->dec_vars = 0;
  this->num_clauses = 0;
  this->num_learnts = 0;
  this->clauses_literals = 0;
  this->learnts_literals = 0;
  this->max_literals = 0;
  this->tot_literals = 0;
  vec<unsigned_int,_int>::vec(&this->clauses);
  vec<unsigned_int,_int>::vec(&this->learnts);
  vec<Minisat::Lit,_int>::vec(&this->trail);
  vec<int,_int>::vec(&this->trail_lim);
  vec<Minisat::Lit,_int>::vec(&this->assumptions);
  VMap<double>::VMap(&this->activity);
  VMap<Minisat::lbool>::VMap(&this->assigns);
  VMap<char>::VMap(&this->polarity);
  VMap<Minisat::lbool>::VMap(&this->user_pol);
  VMap<char>::VMap(&this->decision);
  VMap<Minisat::Solver::VarData>::VMap(&this->vardata);
  WatcherDeleted::WatcherDeleted(local_28,&this->ca);
  OccLists<Minisat::Lit,_Minisat::vec<Minisat::Solver::Watcher,_int>,_Minisat::Solver::WatcherDeleted,_Minisat::MkIndexLit>
  ::OccLists(&this->watches,local_28);
  VarOrderLt::VarOrderLt
            (local_38,&(this->activity).super_IntMap<int,_double,_Minisat::MkIndexDefault<int>_>);
  Heap<int,_Minisat::Solver::VarOrderLt,_Minisat::MkIndexDefault<int>_>::Heap
            (&this->order_heap,local_38);
  this->ok = true;
  this->cla_inc = 1.0;
  this->var_inc = 1.0;
  this->qhead = 0;
  this->simpDB_assigns = -1;
  this->simpDB_props = 0;
  this->progress_estimate = 0.0;
  this->remove_satisfied = true;
  this->next_var = 0;
  ClauseAllocator::ClauseAllocator(&this->ca);
  vec<int,_int>::vec(&this->released_vars);
  vec<int,_int>::vec(&this->free_vars);
  VMap<char>::VMap(&this->seen);
  vec<Minisat::Solver::ShrinkStackElem,_int>::vec(&this->analyze_stack);
  vec<Minisat::Lit,_int>::vec(&this->analyze_toclear);
  vec<Minisat::Lit,_int>::vec(&this->add_tmp);
  this->conflict_budget = -1;
  this->propagation_budget = -1;
  this->asynch_interrupt = false;
  return;
}

Assistant:

Solver::Solver() :

    // Parameters (user settable):
    //
    verbosity        (0)
  , var_decay        (opt_var_decay)
  , clause_decay     (opt_clause_decay)
  , random_var_freq  (opt_random_var_freq)
  , random_seed      (opt_random_seed)
  , luby_restart     (opt_luby_restart)
  , ccmin_mode       (opt_ccmin_mode)
  , phase_saving     (opt_phase_saving)
  , rnd_pol          (false)
  , rnd_init_act     (opt_rnd_init_act)
  , garbage_frac     (opt_garbage_frac)
  , min_learnts_lim  (opt_min_learnts_lim)
  , restart_first    (opt_restart_first)
  , restart_inc      (opt_restart_inc)

    // Parameters (the rest):
    //
  , learntsize_factor((double)1/(double)3), learntsize_inc(1.1)

    // Parameters (experimental):
    //
  , learntsize_adjust_start_confl (100)
  , learntsize_adjust_inc         (1.5)

    // Statistics: (formerly in 'SolverStats')
    //
  , solves(0), starts(0), decisions(0), rnd_decisions(0), propagations(0), conflicts(0)
  , dec_vars(0), num_clauses(0), num_learnts(0), clauses_literals(0), learnts_literals(0), max_literals(0), tot_literals(0)

  , watches            (WatcherDeleted(ca))
  , order_heap         (VarOrderLt(activity))
  , ok                 (true)
  , cla_inc            (1)
  , var_inc            (1)
  , qhead              (0)
  , simpDB_assigns     (-1)
  , simpDB_props       (0)
  , progress_estimate  (0)
  , remove_satisfied   (true)
  , next_var           (0)

    // Resource constraints:
    //
  , conflict_budget    (-1)
  , propagation_budget (-1)
  , asynch_interrupt   (false)
{}